

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assign_inliner.cpp
# Opt level: O0

unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_> __thiscall
verilogAST::AssignInliner::process_assign<verilogAST::BlockingAssign>
          (AssignInliner *this,
          unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_>
          *node)

{
  pointer pBVar1;
  unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_> *in_RDX;
  anon_class_24_3_01e97c98 local_80;
  bool local_62;
  anon_class_1_0_00000001 local_61;
  undefined1 local_60 [6];
  bool remove;
  string key;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_30;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_28 [2];
  unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_>
  *node_local;
  AssignInliner *this_local;
  
  node_local = node;
  this_local = this;
  pBVar1 = std::
           unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_>
           ::operator->(in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::unique_ptr
            (&local_30,
             (unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> *)
             (pBVar1 + 0x20));
  (**(code **)(node->_M_t).
              super___uniq_ptr_impl<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::BlockingAssign_*,_std::default_delete<verilogAST::BlockingAssign>_>
              .super__Head_base<0UL,_verilogAST::BlockingAssign_*,_false>._M_head_impl)
            (local_28,node,&local_30);
  pBVar1 = std::
           unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_>
           ::operator->(in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::operator=
            ((unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> *)
             (pBVar1 + 0x20),local_28);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (local_28);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_30);
  pBVar1 = std::
           unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_>
           ::operator->(in_RDX);
  std::
  visit_abi_cxx11_<verilogAST::AssignInliner::process_assign<verilogAST::BlockingAssign>(std::unique_ptr<verilogAST::BlockingAssign,std::default_delete<verilogAST::BlockingAssign>>)::_lambda(auto:1&&)_1_,std::variant<std::unique_ptr<verilogAST::Identifier,std::default_delete<verilogAST::Identifier>>,std::unique_ptr<verilogAST::Index,std::default_delete<verilogAST::Index>>,std::unique_ptr<verilogAST::Slice,std::default_delete<verilogAST::Slice>>>&>
            ((__visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_leonardt[P]verilogAST_cpp_src_assign_inliner_cpp:217:18),_std::variant<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Index>,_std::unique_ptr<verilogAST::Slice>_>_&>
              *)local_60,&local_61,
             (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>_>
              *)(pBVar1 + 0x10));
  local_62 = false;
  local_80.remove = &local_62;
  local_80.this = (AssignInliner *)node;
  local_80.key = (__visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_leonardt[P]verilogAST_cpp_src_assign_inliner_cpp:217:18),_std::variant<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Index>,_std::unique_ptr<verilogAST::Slice>_>_&>
                  *)local_60;
  pBVar1 = std::
           unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_>
           ::operator->(in_RDX);
  std::
  visit<verilogAST::AssignInliner::process_assign<verilogAST::BlockingAssign>(std::unique_ptr<verilogAST::BlockingAssign,std::default_delete<verilogAST::BlockingAssign>>)::_lambda(auto:1&&)_2_,std::variant<std::unique_ptr<verilogAST::Identifier,std::default_delete<verilogAST::Identifier>>,std::unique_ptr<verilogAST::Index,std::default_delete<verilogAST::Index>>,std::unique_ptr<verilogAST::Slice,std::default_delete<verilogAST::Slice>>>&>
            (&local_80,
             (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>_>
              *)(pBVar1 + 0x10));
  if ((local_62 & 1U) == 0) {
    std::unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_>::
    unique_ptr((unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_>
                *)this,in_RDX);
  }
  else {
    std::unique_ptr<verilogAST::BlockingAssign,std::default_delete<verilogAST::BlockingAssign>>::
    unique_ptr<std::default_delete<verilogAST::BlockingAssign>,void>
              ((unique_ptr<verilogAST::BlockingAssign,std::default_delete<verilogAST::BlockingAssign>>
                *)this);
  }
  std::__cxx11::string::~string((string *)local_60);
  return (__uniq_ptr_data<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>,_true,_true>
          )(__uniq_ptr_data<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> AssignInliner::process_assign(std::unique_ptr<T> node) {
  node->value = this->visit(std::move(node->value));
  std::string key =
      std::visit([](auto&& value) -> std::string { return value->toString(); },
                 node->target);
  bool remove = false;
  std::visit(
      [&](auto&& value) {
        if (auto ptr = dynamic_cast<Identifier*>(value.get())) {
          if (this->can_inline(key) && this->non_input_ports.count(key) == 0) {
            remove = true;
          } else if (this->inlined_outputs.count(ptr->toString())) {
            remove = true;
          };
        }
      },
      node->target);
  if (remove) {
    return std::unique_ptr<T>{};
  }
  return node;
}